

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O0

void write_unsigned<unsigned_int>
               (raw_ostream *S,uint N,size_t MinDigits,IntegerStyle Style,bool IsNegative)

{
  bool IsNegative_local;
  IntegerStyle Style_local;
  size_t MinDigits_local;
  uint N_local;
  raw_ostream *S_local;
  
  write_unsigned_impl<unsigned_int>(S,N,MinDigits,Style,IsNegative);
  return;
}

Assistant:

static void write_unsigned(raw_ostream &S, T N, size_t MinDigits,
                           IntegerStyle Style, bool IsNegative = false) {
  // Output using 32-bit div/mod if possible.
  if (N == static_cast<uint32_t>(N))
    write_unsigned_impl(S, static_cast<uint32_t>(N), MinDigits, Style,
                        IsNegative);
  else
    write_unsigned_impl(S, N, MinDigits, Style, IsNegative);
}